

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteSwitch<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  VectorType VVar1;
  VectorType VVar2;
  Vector *in_RSI;
  Vector *in_RDI;
  VectorType right_vector_type;
  VectorType left_vector_type;
  undefined7 unaff_retaddr;
  idx_t in_stack_00000028;
  Vector *in_stack_00000030;
  Vector *in_stack_00000038;
  Vector *in_stack_00000040;
  bool in_stack_000000e7;
  idx_t in_stack_000000e8;
  Vector *in_stack_000000f0;
  Vector *in_stack_000000f8;
  Vector *in_stack_00000100;
  undefined1 fun_00;
  
  VVar1 = Vector::GetVectorType(in_RDI);
  fun_00 = (undefined1)((ulong)in_RDI >> 0x38);
  VVar2 = Vector::GetVectorType(in_RSI);
  if ((VVar1 == CONSTANT_VECTOR) && (VVar2 == CONSTANT_VECTOR)) {
    ExecuteConstant<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
              (result,(Vector *)count,(Vector *)CONCAT17(fun,unaff_retaddr),(bool)fun_00);
  }
  else if ((VVar1 == FLAT_VECTOR) && (VVar2 == CONSTANT_VECTOR)) {
    ExecuteFlat<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool,false,true>
              (left,right,result,count,fun);
  }
  else if ((VVar1 == CONSTANT_VECTOR) && (VVar2 == FLAT_VECTOR)) {
    ExecuteFlat<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool,true,false>
              (left,right,result,count,fun);
  }
  else if ((VVar1 == FLAT_VECTOR) && (VVar2 == FLAT_VECTOR)) {
    ExecuteFlat<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool,false,false>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,left._7_1_);
  }
  else {
    ExecuteGeneric<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool>
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
               in_stack_000000e7);
  }
  return;
}

Assistant:

static void ExecuteSwitch(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto left_vector_type = left.GetVectorType();
		auto right_vector_type = right.GetVectorType();
		if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
			ExecuteConstant<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(left, right, result, fun);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (left_vector_type == VectorType::FLAT_VECTOR && right_vector_type == VectorType::CONSTANT_VECTOR) {
			ExecuteFlat<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, false, true>(left, right, result,
			                                                                                  count, fun);
		} else if (left_vector_type == VectorType::CONSTANT_VECTOR && right_vector_type == VectorType::FLAT_VECTOR) {
			ExecuteFlat<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, true, false>(left, right, result,
			                                                                                  count, fun);
		} else if (left_vector_type == VectorType::FLAT_VECTOR && right_vector_type == VectorType::FLAT_VECTOR) {
			ExecuteFlat<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, false, false>(left, right, result,
			                                                                                   count, fun);
#endif
		} else {
			ExecuteGeneric<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(left, right, result, count, fun);
		}
	}